

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O2

void hexdumpwords<unsigned_int*>(string *str,uint *buf,size_t nLength,char sep)

{
  size_t sVar1;
  char *pcVar2;
  
  std::__cxx11::string::resize((ulong)str);
  pcVar2 = (str->_M_dataplus)._M_p + str->_M_string_length + nLength * -5;
  for (sVar1 = 0; nLength != sVar1; sVar1 = sVar1 + 1) {
    *pcVar2 = sep;
    word2hexchars((uint16_t)buf[sVar1 * 2],pcVar2 + 1);
    pcVar2 = pcVar2 + 5;
  }
  return;
}

Assistant:

void hexdumpwords(std::string &str, I buf, size_t nLength, char sep=' ')
{
    str.resize(str.size()+nLength*5);
    char *p= &str[str.size()-nLength*5];
    while(nLength--)
    {
        *p++ = sep;
        word2hexchars(get16le(buf), p); p+=4; buf+=2;
    }
}